

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quick_impl.cc
# Opt level: O2

void __thiscall
QuickImpl::ProcessHelloOk(QuickImpl *this,string *ip,uint16_t port,uint8_t *data,int16_t data_len)

{
  iterator iVar1;
  key_type *__k;
  Location local_28;
  
  __k = (key_type *)(data + 1);
  iVar1 = std::
          _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_std::unique_ptr<QuickConnection,_std::default_delete<QuickConnection>_>_>,_std::allocator<std::pair<const_unsigned_int,_std::unique_ptr<QuickConnection,_std::default_delete<QuickConnection>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
          ::find(&(this->_connections)._M_h,__k);
  if (iVar1.
      super__Node_iterator_base<std::pair<const_unsigned_int,_std::unique_ptr<QuickConnection,_std::default_delete<QuickConnection>_>_>,_false>
      ._M_cur == (__node_type *)0x0) {
    local_28._function_name = "ProcessHelloOk";
    local_28._file_name =
         "/workspace/llm4binary/github/license_all_cmakelists_25/boss-li[P]quick/quick/quick_impl.cc"
    ;
    local_28._line_number = 0xfd;
    LogWrapper::Write(&g_quic_log,&local_28,2,anon_var_dwarf_72310,(ulong)*__k);
  }
  else {
    *(undefined1 *)
     (*(long *)((long)iVar1.
                      super__Node_iterator_base<std::pair<const_unsigned_int,_std::unique_ptr<QuickConnection,_std::default_delete<QuickConnection>_>_>,_false>
                      ._M_cur + 0x10) + 0x5c) = 1;
    local_28._function_name = "ProcessHelloOk";
    local_28._file_name =
         "/workspace/llm4binary/github/license_all_cmakelists_25/boss-li[P]quick/quick/quick_impl.cc"
    ;
    local_28._line_number = 0x101;
    LogWrapper::Write(&g_quic_log,&local_28,2,anon_var_dwarf_72326);
    (**(code **)(*(long *)this->_quick_cb + 0x10))(this->_quick_cb,*__k);
  }
  return;
}

Assistant:

void QuickImpl::ProcessHelloOk(const std::string &ip, uint16_t port, const uint8_t* data, int16_t data_len)
{
	QuickHelloOk* msg = (QuickHelloOk*)data;
	auto iter = _connections.find(msg->session_id);
	if (iter == _connections.end()) {
		g_quic_log.Write(RTC_FROM_HERE, LOG_LEVEL_INFO, "�Ҳ�����Ӧ��session id %u", msg->session_id);
		return;
	}
	iter->second->SetServerState(true);
	g_quic_log.Write(RTC_FROM_HERE, LOG_LEVEL_INFO, "�յ� hello ok��Ϣ�� �����ѽ���");
	_quick_cb->OnConnected(msg->session_id);
}